

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor_extras.c
# Opt level: O0

void stack_conn(_glist *x,t_object *new,int *newoutlet,t_object *org,int orgoutlet,_outconnect *conn
               )

{
  t_object *ptVar1;
  int index1;
  int index1_00;
  int index2;
  t_gobj *ptVar2;
  void *pvVar3;
  int dest_i;
  int org_i;
  int new_i;
  int which;
  _inlet *in;
  t_object *dest;
  _outconnect *conn_local;
  t_object *ptStack_28;
  int orgoutlet_local;
  t_object *org_local;
  int *newoutlet_local;
  t_object *new_local;
  _glist *x_local;
  
  in = (_inlet *)0x0;
  _new_i = (_inlet *)0x0;
  if (conn != (_outconnect *)0x0) {
    dest = (t_object *)conn;
    conn_local._4_4_ = orgoutlet;
    ptStack_28 = org;
    org_local = (t_object *)newoutlet;
    newoutlet_local = (int *)new;
    new_local = &x->gl_obj;
    dest = (t_object *)obj_nexttraverseoutlet(conn,(t_object **)&in,(_inlet **)&new_i,&org_i);
    stack_conn((_glist *)new_local,(t_object *)newoutlet_local,(int *)org_local,ptStack_28,
               conn_local._4_4_,(_outconnect *)dest);
    ptVar1 = new_local;
    ptVar2 = o2g((t_object *)newoutlet_local);
    index1 = canvas_getindex((_glist *)ptVar1,ptVar2);
    ptVar1 = new_local;
    ptVar2 = o2g(ptStack_28);
    index1_00 = canvas_getindex((_glist *)ptVar1,ptVar2);
    ptVar1 = new_local;
    ptVar2 = o2g((t_object *)in);
    index2 = canvas_getindex((_glist *)ptVar1,ptVar2);
    obj_disconnect(ptStack_28,conn_local._4_4_,(t_object *)in,org_i);
    ptVar1 = new_local;
    pvVar3 = canvas_undo_set_disconnect((_glist *)new_local,index1_00,conn_local._4_4_,index2,org_i)
    ;
    canvas_undo_add((_glist *)ptVar1,UNDO_DISCONNECT,"disconnect",pvVar3);
    obj_connect((t_object *)newoutlet_local,*(int *)&(org_local->te_g).g_pd,(t_object *)in,org_i);
    ptVar1 = new_local;
    pvVar3 = canvas_undo_set_connect
                       ((_glist *)new_local,index1,*(int *)&(org_local->te_g).g_pd,index2,org_i);
    canvas_undo_add((_glist *)ptVar1,UNDO_CONNECT,"connect",pvVar3);
    *(int *)&(org_local->te_g).g_pd = *(int *)&(org_local->te_g).g_pd + 1;
  }
  return;
}

Assistant:

static void stack_conn(t_glist*x, t_object*new, int*newoutlet, t_object*org,
    int orgoutlet, t_outconnect*conn)
{
    t_object*dest=0;
    t_inlet *in =0;
    int which;
    int new_i, org_i, dest_i;
    if(!conn)
        return;
    conn=obj_nexttraverseoutlet(conn, &dest, &in, &which);
    stack_conn(x, new, newoutlet, org, orgoutlet, conn);
    new_i = canvas_getindex(x, o2g(new));
    org_i = canvas_getindex(x, o2g(org));
    dest_i = canvas_getindex(x, o2g(dest));
    obj_disconnect(org, orgoutlet, dest, which);
    canvas_undo_add(x, UNDO_DISCONNECT, "disconnect",
        canvas_undo_set_disconnect(x, org_i, orgoutlet, dest_i, which));
    obj_connect(new, *newoutlet, dest, which);
    canvas_undo_add(x, UNDO_CONNECT, "connect",
        canvas_undo_set_connect(x, new_i, *newoutlet, dest_i, which));
    (*newoutlet)++;
}